

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::createArrayLength(Builder *this,Id base,uint member)

{
  Id IVar1;
  Id IVar2;
  tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  
  IVar1 = makeIntegerType(this,0x20,false);
  this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       operator_new(0x60);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  *(undefined ***)
   this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl = &PTR__Instruction_0093fd28;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8) = IVar2;
  *(Id *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0xc) = IVar1;
  *(Op *)((long)this_00.
                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x10) =
       OpArrayLength;
  (((_Bit_iterator *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x40))->
  super__Bit_iterator_base)._M_p = (_Bit_type *)0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x48) = 0;
  (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18))->
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
  (((vector<bool,_std::allocator<bool>_> *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
  super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)this_00.
                  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                  .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x38) = 0;
  *(_Bit_pointer *)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) = (_Bit_pointer)0x0
  ;
  *(Block **)
   ((long)this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x58) = (Block *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((long)this_00.
                    super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                    .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x18),2);
  if (*(_Bit_pointer *)
       ((long)this_00.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x50) ==
      (((vector<bool,_std::allocator<bool>_> *)
       ((long)this_00.
              super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
              super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30))->
      super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)this_00.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 0x30),2);
  }
  Instruction::addIdOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,base);
  Instruction::addImmediateOperand
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,member);
  local_38._M_t.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       (tuple<spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
       this_00.super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl;
  addInstruction(this,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                      &local_38);
  if ((_Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>)
      local_38._M_t.
      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
      super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl != (Instruction *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                          .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8))();
  }
  return *(Id *)((long)this_00.
                       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                       .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 8);
}

Assistant:

Id Builder::createArrayLength(Id base, unsigned int member)
{
    spv::Id intType = makeUintType(32);
    Instruction* length = new Instruction(getUniqueId(), intType, OpArrayLength);
    length->reserveOperands(2);
    length->addIdOperand(base);
    length->addImmediateOperand(member);
    addInstruction(std::unique_ptr<Instruction>(length));

    return length->getResultId();
}